

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void nn_list_insert(nn_list *self,nn_list_item *item,nn_list_item *it)

{
  nn_list_item *pnVar1;
  nn_list *pnVar2;
  nn_list_item *pnVar3;
  
  if (item->prev != (nn_list_item *)0xffffffffffffffff) {
    nn_list_insert_cold_1();
  }
  pnVar2 = (nn_list *)it;
  if (it == (nn_list_item *)0x0) {
    pnVar2 = self;
  }
  pnVar1 = pnVar2->last;
  item->prev = pnVar1;
  item->next = it;
  pnVar3 = it;
  if (pnVar1 != (nn_list_item *)0x0) {
    pnVar1->next = item;
    pnVar3 = item->next;
  }
  if (pnVar3 != (nn_list_item *)0x0) {
    pnVar3->prev = item;
  }
  if (self->first == (nn_list_item *)0x0 || self->first == it) {
    self->first = item;
  }
  if (it != (nn_list_item *)0x0) {
    return;
  }
  self->last = item;
  return;
}

Assistant:

void nn_list_insert (struct nn_list *self, struct nn_list_item *item,
    struct nn_list_item *it)
{
    nn_assert (!nn_list_item_isinlist (item));

    item->prev = it ? it->prev : self->last;
    item->next = it;
    if (item->prev)
        item->prev->next = item;
    if (item->next)
        item->next->prev = item;
    if (!self->first || self->first == it)
        self->first = item;
    if (!it)
        self->last = item;
}